

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.h
# Opt level: O0

cmCommand * __thiscall cmMathCommand::Clone(cmMathCommand *this)

{
  cmCommand *this_00;
  cmMathCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmMathCommand((cmMathCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmMathCommand; }